

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void setup_r(int *rex,int *r,int v)

{
  int local_1c;
  int v_local;
  int *r_local;
  int *rex_local;
  
  if ((((rex == (int *)0x0) || (*rex < 0)) && (*r < 0)) && ((-1 < v && (v < 0x22)))) {
    local_1c = v;
    if (0xf < v) {
      local_1c = v + -0x10;
    }
    if (7 < local_1c) {
      if (rex != (int *)0x0) {
        *rex = 1;
      }
      local_1c = local_1c + -8;
    }
    *r = local_1c;
    return;
  }
  __assert_fail("(rex == ((void*)0) || *rex < 0) && *r < 0 && v >= 0 && v <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x85d,"void setup_r(int *, int *, int)");
}

Assistant:

static void setup_r (int *rex, int *r, int v) {
  gen_assert ((rex == NULL || *rex < 0) && *r < 0 && v >= 0 && v <= MAX_HARD_REG);
  if (v >= 16) v -= 16;
  if (v >= 8) {
    if (rex != NULL) *rex = 1;
    v -= 8;
  }
  *r = v;
}